

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

void __thiscall SceneParser::parseFile(SceneParser *this)

{
  int iVar1;
  Group *pGVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  size_type *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char token [100];
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  string local_d8;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  undefined2 local_a8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar1 = getToken(this,&local_b8);
  if (iVar1 != 0) {
    do {
      auVar6[0] = -((char)local_a8 == 'a');
      auVar6[1] = -((char)((ushort)local_a8 >> 8) == '\0');
      auVar6[2] = 0xff;
      auVar6[3] = 0xff;
      auVar6[4] = 0xff;
      auVar6[5] = 0xff;
      auVar6[6] = 0xff;
      auVar6[7] = 0xff;
      auVar6[8] = 0xff;
      auVar6[9] = 0xff;
      auVar6[10] = 0xff;
      auVar6[0xb] = 0xff;
      auVar6[0xc] = 0xff;
      auVar6[0xd] = 0xff;
      auVar6[0xe] = 0xff;
      auVar6[0xf] = 0xff;
      auVar7[0] = -(local_b8 == 'P');
      auVar7[1] = -(cStack_b7 == 'e');
      auVar7[2] = -(cStack_b6 == 'r');
      auVar7[3] = -(cStack_b5 == 's');
      auVar7[4] = -(cStack_b4 == 'p');
      auVar7[5] = -(cStack_b3 == 'e');
      auVar7[6] = -(cStack_b2 == 'c');
      auVar7[7] = -(cStack_b1 == 't');
      auVar7[8] = -(cStack_b0 == 'i');
      auVar7[9] = -(cStack_af == 'v');
      auVar7[10] = -(cStack_ae == 'e');
      auVar7[0xb] = -(cStack_ad == 'C');
      auVar7[0xc] = -(cStack_ac == 'a');
      auVar7[0xd] = -(cStack_ab == 'm');
      auVar7[0xe] = -(cStack_aa == 'e');
      auVar7[0xf] = -(cStack_a9 == 'r');
      auVar7 = auVar7 & auVar6;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
        parsePerspectiveCamera(this);
      }
      else if (CONCAT17(cStack_ae,
                        CONCAT16(cStack_af,
                                 CONCAT15(cStack_b0,
                                          CONCAT14(cStack_b1,
                                                   CONCAT13(cStack_b2,
                                                            CONCAT12(cStack_b3,
                                                                     CONCAT11(cStack_b4,cStack_b5)))
                                                  )))) == 0x646e756f72676b &&
               CONCAT17(cStack_b1,
                        CONCAT16(cStack_b2,
                                 CONCAT15(cStack_b3,
                                          CONCAT14(cStack_b4,
                                                   CONCAT13(cStack_b5,
                                                            CONCAT12(cStack_b6,
                                                                     CONCAT11(cStack_b7,local_b8))))
                                         ))) == 0x756f72676b636142) {
        parseBackground(this);
      }
      else if (CONCAT11(cStack_af,cStack_b0) == 0x73 &&
               CONCAT17(cStack_b1,
                        CONCAT16(cStack_b2,
                                 CONCAT15(cStack_b3,
                                          CONCAT14(cStack_b4,
                                                   CONCAT13(cStack_b5,
                                                            CONCAT12(cStack_b6,
                                                                     CONCAT11(cStack_b7,local_b8))))
                                         ))) == 0x6c6169726574614d) {
        parseMaterials(this);
      }
      else {
        if (CONCAT11(cStack_b3,cStack_b4) != 0x70 ||
            CONCAT13(cStack_b5,CONCAT12(cStack_b6,CONCAT11(cStack_b7,local_b8))) != 0x756f7247) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Unknown token in parseFile: \'","");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
          local_f8 = (long *)*plVar3;
          plVar4 = plVar3 + 2;
          if (local_f8 == plVar4) {
            local_e8 = *plVar4;
            lStack_e0 = plVar3[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar4;
          }
          local_f0 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_d8._M_dataplus._M_p = (pointer)*plVar3;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((size_type *)local_d8._M_dataplus._M_p == psVar5) {
            local_d8.field_2._M_allocated_capacity = *psVar5;
            local_d8.field_2._8_8_ = plVar3[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar5;
          }
          local_d8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          _PostError(&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          _Unwind_Resume(extraout_RAX);
        }
        pGVar2 = parseGroup(this);
        this->_group = pGVar2;
      }
      iVar1 = getToken(this,&local_b8);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void
SceneParser::parseFile() {
    // At the top level, the scene can have a camera,
    // background color and a group of objects.
    char token[MAX_PARSER_TOKEN_LENGTH];
    while (getToken(token)) {
        if (!strcmp(token, "PerspectiveCamera")) {
            parsePerspectiveCamera();
        } else if (!strcmp(token, "Background")) {
            parseBackground();
        } else if (!strcmp(token, "Materials")) {
            parseMaterials();
        } else if (!strcmp(token, "Group")) {
            _group = parseGroup();
        } else {
            _PostError(
                    std::string("Unknown token in parseFile: '") + token + "'\n");
            exit(1);
        }
    }
}